

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O3

vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *
__thiscall
polyscope::
adaptorF_convertArrayOfVectorToStdVectorImpl<std::array<unsigned_long,2ul>,2u,std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>,void>
          (vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
           *__return_storage_ptr__,polyscope *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  pointer paVar3;
  long lVar4;
  size_type __n;
  allocator_type local_29;
  
  lVar2 = *(long *)(this + 8);
  lVar4 = *(long *)this;
  __n = lVar2 - lVar4 >> 3;
  std::vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>::
  vector(__return_storage_ptr__,__n,&local_29);
  if (lVar2 != lVar4) {
    lVar2 = *(long *)this;
    paVar3 = (__return_storage_ptr__->
             super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(lVar2 + lVar4 * 8);
      auVar1 = vpmovsxdq_avx(auVar1);
      lVar4 = lVar4 + 1;
      *(undefined1 (*) [16])paVar3->_M_elems = auVar1;
      paVar3 = paVar3 + 1;
    } while (__n + (__n == 0) != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<O> adaptorF_convertArrayOfVectorToStdVectorImpl(PreferenceT<7>, const T& inputData) {
  size_t dataSize = adaptorF_size(inputData);
  std::vector<O> dataOut(dataSize);
  for (size_t i = 0; i < dataSize; i++) {
    for (size_t j = 0; j < D; j++) {
      dataOut[i][j] = inputData[i][j];
    }
  }
  return dataOut;
}